

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrap.cpp
# Opt level: O0

int C_std::my_read(int fd,char *c)

{
  ssize_t sVar1;
  int BUFFSIZ;
  char *c_local;
  int fd_local;
  
  if (my_read::buf_size < 1) {
    sVar1 = Read(fd,my_read::buf,100);
    my_read::buf_size = (int)sVar1;
    my_read::idx = 0;
    if (my_read::buf_size == 0) {
      my_read::buf_size = 0;
      my_read::idx = 0;
      return 0;
    }
  }
  *c = my_read::buf[my_read::idx];
  my_read::idx = my_read::idx + 1;
  my_read::buf_size = my_read::buf_size + -1;
  return 1;
}

Assistant:

int my_read(int fd, char *c) {
        constexpr int BUFFSIZ = 100;
        static char buf[BUFFSIZ];
        static int buf_size = 0;
        static int idx = 0;
        if (buf_size <= 0) {
            buf_size = Read(fd, buf, BUFFSIZ);
            idx = 0;
            if (buf_size == 0) {
                //读入失败
                return 0;
            }
        }
        *c = buf[idx];          //拷贝值，不能让指针指向该静态区域
        ++idx;
        --buf_size;
        return 1;
    }